

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_swap(Tree *this,size_t n_,size_t m_)

{
  code *pcVar1;
  size_t l;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  long in_RDI;
  NodeType tm;
  NodeType tn;
  char msg_1 [59];
  char msg [59];
  size_t in_stack_000002b0;
  size_t in_stack_000002b8;
  Tree *in_stack_000002c0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  Tree *in_stack_fffffffffffffe20;
  code *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 uVar5;
  Tree *in_stack_fffffffffffffe40;
  bool local_1a9;
  NodeType_e local_190;
  NodeType_e local_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 uStack_168;
  undefined4 uStack_164;
  char *local_160;
  undefined1 local_158 [64];
  NodeType_e local_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  NodeType local_a0;
  size_t local_80;
  NodeType_e *local_78;
  size_t local_70;
  NodeType_e *local_68;
  char *local_60;
  NodeType_e *local_58;
  char *local_50;
  undefined1 *local_48;
  size_t local_40;
  NodeType_e *local_38;
  size_t local_30;
  NodeType_e *local_28;
  size_t local_20;
  NodeType_e *local_18;
  char *local_10;
  NodeType_e *local_8;
  
  sVar4 = parent((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_1a9 = true;
  if (sVar4 == 0xffffffffffffffff) {
    local_a0 = type((Tree *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df2af);
    local_48 = (undefined1 *)&stack0xffffffffffffff60;
    local_50 = (char *)0x0;
    local_1a9 = local_a0.type == NOTYPE;
  }
  if (!local_1a9) {
    memcpy(&stack0xffffffffffffff18,"check failed: ((parent(n_) != NONE) || type(n_) == NOTYPE)",
           0x3b);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    in_stack_fffffffffffffe40 = (Tree *)&stack0xffffffffffffff18;
    Location::Location((Location *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(in_stack_fffffffffffffe40,0x3b,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_110;
    in_stack_fffffffffffffdfc = uStack_10c;
    in_stack_fffffffffffffe00 = uStack_108;
    in_stack_fffffffffffffe04 = uStack_104;
    in_stack_fffffffffffffe08 = local_100;
    in_stack_fffffffffffffe0c = uStack_fc;
    in_stack_fffffffffffffe10 = uStack_f8;
    in_stack_fffffffffffffe14 = uStack_f4;
    in_stack_fffffffffffffe18 = local_f0;
  }
  sVar4 = parent((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  uVar5 = true;
  if (sVar4 == 0xffffffffffffffff) {
    local_118 = (NodeType_e)
                type((Tree *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df3e7)
    ;
    local_58 = &local_118;
    local_60 = (char *)0x0;
    uVar5 = local_118 == NOTYPE;
  }
  if (((uVar5 ^ 0xff) & 1) != 0) {
    memcpy(local_158,"check failed: ((parent(m_) != NONE) || type(m_) == NOTYPE)",0x3b);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe30 = *(code **)(in_RDI + 0x58);
    l = CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
    sVar4 = CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe00 = in_stack_fffffffffffffe88;
    in_stack_fffffffffffffe04 = in_stack_fffffffffffffe8c;
    in_stack_fffffffffffffe08 = in_stack_fffffffffffffe90;
    in_stack_fffffffffffffe0c = in_stack_fffffffffffffe94;
    Location::Location((Location *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),l,sVar4);
    in_stack_fffffffffffffe88 = in_stack_fffffffffffffe00;
    in_stack_fffffffffffffe8c = in_stack_fffffffffffffe04;
    in_stack_fffffffffffffe90 = in_stack_fffffffffffffe08;
    in_stack_fffffffffffffe94 = in_stack_fffffffffffffe0c;
    (*in_stack_fffffffffffffe30)(local_158,0x3b,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_180;
    in_stack_fffffffffffffdfc = uStack_17c;
    in_stack_fffffffffffffe10 = uStack_168;
    in_stack_fffffffffffffe14 = uStack_164;
    in_stack_fffffffffffffe18 = local_160;
  }
  local_188 = (NodeType_e)
              type((Tree *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df4fc);
  local_190 = (NodeType_e)
              type((Tree *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df516);
  local_8 = &local_188;
  local_10 = (char *)0x0;
  if (local_188 != NOTYPE) {
    local_18 = &local_190;
    local_20 = 0;
    if (local_190 != NOTYPE) {
      _swap_props(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      _swap_hierarchy(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
      return;
    }
  }
  local_68 = &local_188;
  local_70 = 0;
  if (local_188 == NOTYPE) {
    local_28 = &local_190;
    local_30 = 0;
    if (local_190 != NOTYPE) {
      _copy_props((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df630);
      _free_list_rem((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      _copy_hierarchy(in_stack_fffffffffffffe40,CONCAT17(uVar5,in_stack_fffffffffffffe38),
                      (size_t)in_stack_fffffffffffffe30);
      _clear((Tree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      _free_list_add((Tree *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      return;
    }
  }
  local_38 = &local_188;
  local_40 = 0;
  if (local_188 != NOTYPE) {
    local_78 = &local_190;
    local_80 = 0;
    if (local_190 == NOTYPE) {
      _copy_props((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2df702);
      _free_list_rem((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      _copy_hierarchy(in_stack_fffffffffffffe40,CONCAT17(uVar5,in_stack_fffffffffffffe38),
                      (size_t)in_stack_fffffffffffffe30);
      _clear((Tree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      _free_list_add((Tree *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      return;
    }
  }
  eVar3 = get_error_flags();
  if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    trap_instruction();
  }
  handle_error(0x345f1b,(char *)0x6462,"never reach this point");
  return;
}

Assistant:

void Tree::_swap(size_t n_, size_t m_)
{
    _RYML_CB_ASSERT(m_callbacks, (parent(n_) != NONE) || type(n_) == NOTYPE);
    _RYML_CB_ASSERT(m_callbacks, (parent(m_) != NONE) || type(m_) == NOTYPE);
    NodeType tn = type(n_);
    NodeType tm = type(m_);
    if(tn != NOTYPE && tm != NOTYPE)
    {
        _swap_props(n_, m_);
        _swap_hierarchy(n_, m_);
    }
    else if(tn == NOTYPE && tm != NOTYPE)
    {
        _copy_props(n_, m_);
        _free_list_rem(n_);
        _copy_hierarchy(n_, m_);
        _clear(m_);
        _free_list_add(m_);
    }
    else if(tn != NOTYPE && tm == NOTYPE)
    {
        _copy_props(m_, n_);
        _free_list_rem(m_);
        _copy_hierarchy(m_, n_);
        _clear(n_);
        _free_list_add(n_);
    }
    else
    {
        C4_NEVER_REACH();
    }
}